

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

void s3clr_fattr(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; attrib[local_c] != (char *)0x0; local_c = local_c + 1) {
    if (alloc[local_c] != 0) {
      if (attrib[local_c] != (char *)0x0) {
        free(attrib[local_c]);
      }
      if (value[local_c] != (char *)0x0) {
        free(value[local_c]);
      }
      alloc[local_c] = 0;
    }
  }
  if (local_c == n_attrib) {
    n_attrib = 0;
    value[0] = (char *)0x0;
    attrib[0] = (char *)0x0;
    return;
  }
  __assert_fail("i == n_attrib",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x52,"void s3clr_fattr()");
}

Assistant:

void s3clr_fattr()
{
    int i;

    for (i = 0; attrib[i]; i++) {
	if (alloc[i]) {
	    if (attrib[i]) {
		free(attrib[i]);
	    }
	    if (value[i]) {
		free(value[i]);
	    }	    
	    alloc[i] = FALSE;
	}
    }
    assert(i == n_attrib);
    n_attrib = 0;
    attrib[0] = value[0] = NULL;
}